

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void dct2_butterfly_h16_avx2(s16 *src,int i_src,s16 *dst,int line,int shift,int bit_depth)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  uint uVar170;
  ushort uVar171;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  __m256i min_val;
  __m256i max_val;
  __m256i T28;
  __m256i T29;
  __m256i T2A;
  __m256i T2B;
  __m256i T2C;
  __m256i T2D;
  __m256i T2E;
  __m256i T2F;
  __m256i T27;
  __m256i T26;
  __m256i T25;
  __m256i T24;
  __m256i T23;
  __m256i T22;
  __m256i T21;
  __m256i T20;
  __m256i t17;
  __m256i t16;
  __m256i t15;
  __m256i t14;
  __m256i t13;
  __m256i t12;
  __m256i t11;
  __m256i t10;
  __m256i e4;
  __m256i e5;
  __m256i e6;
  __m256i e7;
  __m256i e3;
  __m256i e2;
  __m256i e1;
  __m256i e0;
  __m256i ee2;
  __m256i ee3;
  __m256i ee1;
  __m256i ee0;
  __m256i eee1;
  __m256i eee0;
  __m256i eeo1;
  __m256i eeo0;
  __m256i eo3;
  __m256i eo2;
  __m256i eo1;
  __m256i eo0;
  __m256i o7;
  __m256i o6;
  __m256i o5;
  __m256i o4;
  __m256i o3;
  __m256i o2;
  __m256i o1;
  __m256i o0;
  __m256i t03;
  __m256i t02;
  __m256i t01;
  __m256i t00;
  __m256i t7;
  __m256i t6;
  __m256i t5;
  __m256i t4;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i res07;
  __m256i res06;
  __m256i res05;
  __m256i res04;
  __m256i res03;
  __m256i res02;
  __m256i res01;
  __m256i res00;
  __m128i ss7;
  __m128i ss6;
  __m128i ss5;
  __m128i ss4;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i src15;
  __m128i src14;
  __m128i src13;
  __m128i src12;
  __m128i src11;
  __m128i src10;
  __m128i src09;
  __m128i src08;
  __m128i src07;
  __m128i src06;
  __m128i src05;
  __m128i src04;
  __m128i src03;
  __m128i src02;
  __m128i src01;
  __m128i src00;
  __m256i c32_off;
  int i;
  __m256i c16_p32_p32;
  __m256i c16_n32_p32;
  __m256i c16_n42_p17;
  __m256i c16_p17_p42;
  __m256i c16_n44_p38;
  __m256i c16_n25_p09;
  __m256i c16_p38_p09;
  __m256i c16_n44_p25;
  __m256i c16_n25_n44;
  __m256i c16_n09_p38;
  __m256i c16_p09_p25;
  __m256i c16_p38_p44;
  __m256i c16_n45_p43;
  __m256i c16_n40_p35;
  __m256i c16_n29_p21;
  __m256i c16_n13_p04;
  __m256i c16_p43_n29;
  __m256i c16_p04_p21;
  __m256i c16_n40_p45;
  __m256i c16_n35_p13;
  __m256i c16_n40_p04;
  __m256i c16_p35_n43;
  __m256i c16_p13_p29;
  __m256i c16_n45_p21;
  __m256i c16_p35_p21;
  __m256i c16_n43_n04;
  __m256i c16_p45_n13;
  __m256i c16_n40_p29;
  __m256i c16_n29_n40;
  __m256i c16_p13_p45;
  __m256i c16_p04_n43;
  __m256i c16_n21_p35;
  __m256i c16_p21_p45;
  __m256i c16_p29_n13;
  __m256i c16_n43_n35;
  __m256i c16_p04_p40;
  __m256i c16_n13_n35;
  __m256i c16_n45_n40;
  __m256i c16_n21_p04;
  __m256i c16_p29_p43;
  __m256i c16_p04_p13;
  __m256i c16_p21_p29;
  __m256i c16_p35_p40;
  __m256i c16_p43_p45;
  undefined1 local_4540 [32];
  undefined1 local_4520 [32];
  undefined1 local_4500 [32];
  undefined1 local_44e0 [32];
  undefined1 local_44c0 [32];
  undefined1 local_44a0 [32];
  undefined1 local_4480 [32];
  undefined1 local_4460 [32];
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 local_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 local_4410;
  undefined8 uStack_4408;
  int local_4284;
  byte local_3cfc;
  char local_3cf8;
  undefined8 *local_3cf0;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar9 = vpinsrd_avx(ZEXT416(0x2b002d),0x2b002d,1);
  auVar9 = vpinsrd_avx(auVar9,0x2b002d,2);
  auVar9 = vpinsrd_avx(auVar9,0x2b002d,3);
  auVar10 = vpinsrd_avx(ZEXT416(0x2b002d),0x2b002d,1);
  auVar10 = vpinsrd_avx(auVar10,0x2b002d,2);
  auVar10 = vpinsrd_avx(auVar10,0x2b002d,3);
  uStack_bf0 = auVar10._0_8_;
  uStack_be8 = auVar10._8_8_;
  auVar10 = vpinsrd_avx(ZEXT416(0x230028),0x230028,1);
  auVar10 = vpinsrd_avx(auVar10,0x230028,2);
  auVar10 = vpinsrd_avx(auVar10,0x230028,3);
  auVar11 = vpinsrd_avx(ZEXT416(0x230028),0x230028,1);
  auVar11 = vpinsrd_avx(auVar11,0x230028,2);
  auVar11 = vpinsrd_avx(auVar11,0x230028,3);
  uStack_bb0 = auVar11._0_8_;
  uStack_ba8 = auVar11._8_8_;
  auVar11 = vpinsrd_avx(ZEXT416(0x15001d),0x15001d,1);
  auVar11 = vpinsrd_avx(auVar11,0x15001d,2);
  auVar11 = vpinsrd_avx(auVar11,0x15001d,3);
  auVar12 = vpinsrd_avx(ZEXT416(0x15001d),0x15001d,1);
  auVar12 = vpinsrd_avx(auVar12,0x15001d,2);
  auVar12 = vpinsrd_avx(auVar12,0x15001d,3);
  uStack_b70 = auVar12._0_8_;
  uStack_b68 = auVar12._8_8_;
  auVar12 = vpinsrd_avx(ZEXT416(0x4000d),0x4000d,1);
  auVar12 = vpinsrd_avx(auVar12,0x4000d,2);
  auVar12 = vpinsrd_avx(auVar12,0x4000d,3);
  auVar13 = vpinsrd_avx(ZEXT416(0x4000d),0x4000d,1);
  auVar13 = vpinsrd_avx(auVar13,0x4000d,2);
  auVar13 = vpinsrd_avx(auVar13,0x4000d,3);
  uStack_b30 = auVar13._0_8_;
  uStack_b28 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(0x1d002b),0x1d002b,1);
  auVar13 = vpinsrd_avx(auVar13,0x1d002b,2);
  auVar13 = vpinsrd_avx(auVar13,0x1d002b,3);
  auVar14 = vpinsrd_avx(ZEXT416(0x1d002b),0x1d002b,1);
  auVar14 = vpinsrd_avx(auVar14,0x1d002b,2);
  auVar14 = vpinsrd_avx(auVar14,0x1d002b,3);
  uStack_af0 = auVar14._0_8_;
  uStack_ae8 = auVar14._8_8_;
  auVar14 = vpinsrd_avx(ZEXT416(0xffeb0004),0xffeb0004,1);
  auVar14 = vpinsrd_avx(auVar14,0xffeb0004,2);
  auVar14 = vpinsrd_avx(auVar14,0xffeb0004,3);
  auVar15 = vpinsrd_avx(ZEXT416(0xffeb0004),0xffeb0004,1);
  auVar15 = vpinsrd_avx(auVar15,0xffeb0004,2);
  auVar15 = vpinsrd_avx(auVar15,0xffeb0004,3);
  uStack_ab0 = auVar15._0_8_;
  uStack_aa8 = auVar15._8_8_;
  auVar15 = vpinsrd_avx(ZEXT416(0xffd3ffd8),0xffd3ffd8,1);
  auVar15 = vpinsrd_avx(auVar15,0xffd3ffd8,2);
  auVar15 = vpinsrd_avx(auVar15,0xffd3ffd8,3);
  auVar16 = vpinsrd_avx(ZEXT416(0xffd3ffd8),0xffd3ffd8,1);
  auVar16 = vpinsrd_avx(auVar16,0xffd3ffd8,2);
  auVar16 = vpinsrd_avx(auVar16,0xffd3ffd8,3);
  uStack_a70 = auVar16._0_8_;
  uStack_a68 = auVar16._8_8_;
  auVar16 = vpinsrd_avx(ZEXT416(0xfff3ffdd),0xfff3ffdd,1);
  auVar16 = vpinsrd_avx(auVar16,0xfff3ffdd,2);
  auVar16 = vpinsrd_avx(auVar16,0xfff3ffdd,3);
  auVar17 = vpinsrd_avx(ZEXT416(0xfff3ffdd),0xfff3ffdd,1);
  auVar17 = vpinsrd_avx(auVar17,0xfff3ffdd,2);
  auVar17 = vpinsrd_avx(auVar17,0xfff3ffdd,3);
  uStack_a30 = auVar17._0_8_;
  uStack_a28 = auVar17._8_8_;
  auVar17 = vpinsrd_avx(ZEXT416(0x40028),0x40028,1);
  auVar17 = vpinsrd_avx(auVar17,0x40028,2);
  auVar17 = vpinsrd_avx(auVar17,0x40028,3);
  auVar18 = vpinsrd_avx(ZEXT416(0x40028),0x40028,1);
  auVar18 = vpinsrd_avx(auVar18,0x40028,2);
  auVar18 = vpinsrd_avx(auVar18,0x40028,3);
  uStack_9f0 = auVar18._0_8_;
  uStack_9e8 = auVar18._8_8_;
  auVar18 = vpinsrd_avx(ZEXT416(0xffd5ffdd),0xffd5ffdd,1);
  auVar18 = vpinsrd_avx(auVar18,0xffd5ffdd,2);
  auVar18 = vpinsrd_avx(auVar18,0xffd5ffdd,3);
  auVar19 = vpinsrd_avx(ZEXT416(0xffd5ffdd),0xffd5ffdd,1);
  auVar19 = vpinsrd_avx(auVar19,0xffd5ffdd,2);
  auVar19 = vpinsrd_avx(auVar19,0xffd5ffdd,3);
  uStack_9b0 = auVar19._0_8_;
  uStack_9a8 = auVar19._8_8_;
  auVar19 = vpinsrd_avx(ZEXT416(0x1dfff3),0x1dfff3,1);
  auVar19 = vpinsrd_avx(auVar19,0x1dfff3,2);
  auVar19 = vpinsrd_avx(auVar19,0x1dfff3,3);
  auVar20 = vpinsrd_avx(ZEXT416(0x1dfff3),0x1dfff3,1);
  auVar20 = vpinsrd_avx(auVar20,0x1dfff3,2);
  auVar20 = vpinsrd_avx(auVar20,0x1dfff3,3);
  uStack_970 = auVar20._0_8_;
  uStack_968 = auVar20._8_8_;
  auVar20 = vpinsrd_avx(ZEXT416(0x15002d),0x15002d,1);
  auVar20 = vpinsrd_avx(auVar20,0x15002d,2);
  auVar20 = vpinsrd_avx(auVar20,0x15002d,3);
  auVar21 = vpinsrd_avx(ZEXT416(0x15002d),0x15002d,1);
  auVar21 = vpinsrd_avx(auVar21,0x15002d,2);
  auVar21 = vpinsrd_avx(auVar21,0x15002d,3);
  uStack_930 = auVar21._0_8_;
  uStack_928 = auVar21._8_8_;
  auVar21 = vpinsrd_avx(ZEXT416(0xffeb0023),0xffeb0023,1);
  auVar21 = vpinsrd_avx(auVar21,0xffeb0023,2);
  auVar21 = vpinsrd_avx(auVar21,0xffeb0023,3);
  auVar22 = vpinsrd_avx(ZEXT416(0xffeb0023),0xffeb0023,1);
  auVar22 = vpinsrd_avx(auVar22,0xffeb0023,2);
  auVar22 = vpinsrd_avx(auVar22,0xffeb0023,3);
  uStack_8f0 = auVar22._0_8_;
  uStack_8e8 = auVar22._8_8_;
  auVar22 = vpinsrd_avx(ZEXT416(0x4ffd5),0x4ffd5,1);
  auVar22 = vpinsrd_avx(auVar22,0x4ffd5,2);
  auVar22 = vpinsrd_avx(auVar22,0x4ffd5,3);
  auVar23 = vpinsrd_avx(ZEXT416(0x4ffd5),0x4ffd5,1);
  auVar23 = vpinsrd_avx(auVar23,0x4ffd5,2);
  auVar23 = vpinsrd_avx(auVar23,0x4ffd5,3);
  uStack_8b0 = auVar23._0_8_;
  uStack_8a8 = auVar23._8_8_;
  auVar23 = vpinsrd_avx(ZEXT416(0xd002d),0xd002d,1);
  auVar23 = vpinsrd_avx(auVar23,0xd002d,2);
  auVar23 = vpinsrd_avx(auVar23,0xd002d,3);
  auVar24 = vpinsrd_avx(ZEXT416(0xd002d),0xd002d,1);
  auVar24 = vpinsrd_avx(auVar24,0xd002d,2);
  auVar24 = vpinsrd_avx(auVar24,0xd002d,3);
  uStack_870 = auVar24._0_8_;
  uStack_868 = auVar24._8_8_;
  auVar24 = vpinsrd_avx(ZEXT416(0xffe3ffd8),0xffe3ffd8,1);
  auVar24 = vpinsrd_avx(auVar24,0xffe3ffd8,2);
  auVar24 = vpinsrd_avx(auVar24,0xffe3ffd8,3);
  auVar25 = vpinsrd_avx(ZEXT416(0xffe3ffd8),0xffe3ffd8,1);
  auVar25 = vpinsrd_avx(auVar25,0xffe3ffd8,2);
  auVar25 = vpinsrd_avx(auVar25,0xffe3ffd8,3);
  uStack_830 = auVar25._0_8_;
  uStack_828 = auVar25._8_8_;
  auVar25 = vpinsrd_avx(ZEXT416(0xffd8001d),0xffd8001d,1);
  auVar25 = vpinsrd_avx(auVar25,0xffd8001d,2);
  auVar25 = vpinsrd_avx(auVar25,0xffd8001d,3);
  auVar26 = vpinsrd_avx(ZEXT416(0xffd8001d),0xffd8001d,1);
  auVar26 = vpinsrd_avx(auVar26,0xffd8001d,2);
  auVar26 = vpinsrd_avx(auVar26,0xffd8001d,3);
  uStack_7f0 = auVar26._0_8_;
  uStack_7e8 = auVar26._8_8_;
  auVar26 = vpinsrd_avx(ZEXT416(0x2dfff3),0x2dfff3,1);
  auVar26 = vpinsrd_avx(auVar26,0x2dfff3,2);
  auVar26 = vpinsrd_avx(auVar26,0x2dfff3,3);
  auVar27 = vpinsrd_avx(ZEXT416(0x2dfff3),0x2dfff3,1);
  auVar27 = vpinsrd_avx(auVar27,0x2dfff3,2);
  auVar27 = vpinsrd_avx(auVar27,0x2dfff3,3);
  uStack_7b0 = auVar27._0_8_;
  uStack_7a8 = auVar27._8_8_;
  auVar27 = vpinsrd_avx(ZEXT416(0xffd5fffc),0xffd5fffc,1);
  auVar27 = vpinsrd_avx(auVar27,0xffd5fffc,2);
  auVar27 = vpinsrd_avx(auVar27,0xffd5fffc,3);
  auVar28 = vpinsrd_avx(ZEXT416(0xffd5fffc),0xffd5fffc,1);
  auVar28 = vpinsrd_avx(auVar28,0xffd5fffc,2);
  auVar28 = vpinsrd_avx(auVar28,0xffd5fffc,3);
  uStack_770 = auVar28._0_8_;
  uStack_768 = auVar28._8_8_;
  auVar28 = vpinsrd_avx(ZEXT416(0x230015),0x230015,1);
  auVar28 = vpinsrd_avx(auVar28,0x230015,2);
  auVar28 = vpinsrd_avx(auVar28,0x230015,3);
  auVar29 = vpinsrd_avx(ZEXT416(0x230015),0x230015,1);
  auVar29 = vpinsrd_avx(auVar29,0x230015,2);
  auVar29 = vpinsrd_avx(auVar29,0x230015,3);
  uStack_730 = auVar29._0_8_;
  uStack_728 = auVar29._8_8_;
  auVar29 = vpinsrd_avx(ZEXT416(0xffd30015),0xffd30015,1);
  auVar29 = vpinsrd_avx(auVar29,0xffd30015,2);
  auVar29 = vpinsrd_avx(auVar29,0xffd30015,3);
  auVar30 = vpinsrd_avx(ZEXT416(0xffd30015),0xffd30015,1);
  auVar30 = vpinsrd_avx(auVar30,0xffd30015,2);
  auVar30 = vpinsrd_avx(auVar30,0xffd30015,3);
  uStack_6f0 = auVar30._0_8_;
  uStack_6e8 = auVar30._8_8_;
  auVar30 = vpinsrd_avx(ZEXT416(0xd001d),0xd001d,1);
  auVar30 = vpinsrd_avx(auVar30,0xd001d,2);
  auVar30 = vpinsrd_avx(auVar30,0xd001d,3);
  auVar31 = vpinsrd_avx(ZEXT416(0xd001d),0xd001d,1);
  auVar31 = vpinsrd_avx(auVar31,0xd001d,2);
  auVar31 = vpinsrd_avx(auVar31,0xd001d,3);
  uStack_6b0 = auVar31._0_8_;
  uStack_6a8 = auVar31._8_8_;
  auVar31 = vpinsrd_avx(ZEXT416(0x23ffd5),0x23ffd5,1);
  auVar31 = vpinsrd_avx(auVar31,0x23ffd5,2);
  auVar31 = vpinsrd_avx(auVar31,0x23ffd5,3);
  auVar32 = vpinsrd_avx(ZEXT416(0x23ffd5),0x23ffd5,1);
  auVar32 = vpinsrd_avx(auVar32,0x23ffd5,2);
  auVar32 = vpinsrd_avx(auVar32,0x23ffd5,3);
  uStack_670 = auVar32._0_8_;
  uStack_668 = auVar32._8_8_;
  auVar32 = vpinsrd_avx(ZEXT416(0xffd80004),0xffd80004,1);
  auVar32 = vpinsrd_avx(auVar32,0xffd80004,2);
  auVar32 = vpinsrd_avx(auVar32,0xffd80004,3);
  auVar33 = vpinsrd_avx(ZEXT416(0xffd80004),0xffd80004,1);
  auVar33 = vpinsrd_avx(auVar33,0xffd80004,2);
  auVar33 = vpinsrd_avx(auVar33,0xffd80004,3);
  uStack_630 = auVar33._0_8_;
  uStack_628 = auVar33._8_8_;
  auVar33 = vpinsrd_avx(ZEXT416(0xffdd000d),0xffdd000d,1);
  auVar33 = vpinsrd_avx(auVar33,0xffdd000d,2);
  auVar33 = vpinsrd_avx(auVar33,0xffdd000d,3);
  auVar34 = vpinsrd_avx(ZEXT416(0xffdd000d),0xffdd000d,1);
  auVar34 = vpinsrd_avx(auVar34,0xffdd000d,2);
  auVar34 = vpinsrd_avx(auVar34,0xffdd000d,3);
  uStack_5f0 = auVar34._0_8_;
  uStack_5e8 = auVar34._8_8_;
  auVar34 = vpinsrd_avx(ZEXT416(0xffd8002d),0xffd8002d,1);
  auVar34 = vpinsrd_avx(auVar34,0xffd8002d,2);
  auVar34 = vpinsrd_avx(auVar34,0xffd8002d,3);
  auVar35 = vpinsrd_avx(ZEXT416(0xffd8002d),0xffd8002d,1);
  auVar35 = vpinsrd_avx(auVar35,0xffd8002d,2);
  auVar35 = vpinsrd_avx(auVar35,0xffd8002d,3);
  uStack_5b0 = auVar35._0_8_;
  uStack_5a8 = auVar35._8_8_;
  auVar35 = vpinsrd_avx(ZEXT416(0x40015),0x40015,1);
  auVar35 = vpinsrd_avx(auVar35,0x40015,2);
  auVar35 = vpinsrd_avx(auVar35,0x40015,3);
  auVar36 = vpinsrd_avx(ZEXT416(0x40015),0x40015,1);
  auVar36 = vpinsrd_avx(auVar36,0x40015,2);
  auVar36 = vpinsrd_avx(auVar36,0x40015,3);
  uStack_570 = auVar36._0_8_;
  uStack_568 = auVar36._8_8_;
  auVar36 = vpinsrd_avx(ZEXT416(0x2bffe3),0x2bffe3,1);
  auVar36 = vpinsrd_avx(auVar36,0x2bffe3,2);
  auVar36 = vpinsrd_avx(auVar36,0x2bffe3,3);
  auVar37 = vpinsrd_avx(ZEXT416(0x2bffe3),0x2bffe3,1);
  auVar37 = vpinsrd_avx(auVar37,0x2bffe3,2);
  auVar37 = vpinsrd_avx(auVar37,0x2bffe3,3);
  uStack_530 = auVar37._0_8_;
  uStack_528 = auVar37._8_8_;
  auVar37 = vpinsrd_avx(ZEXT416(0xfff30004),0xfff30004,1);
  auVar37 = vpinsrd_avx(auVar37,0xfff30004,2);
  auVar37 = vpinsrd_avx(auVar37,0xfff30004,3);
  auVar38 = vpinsrd_avx(ZEXT416(0xfff30004),0xfff30004,1);
  auVar38 = vpinsrd_avx(auVar38,0xfff30004,2);
  auVar38 = vpinsrd_avx(auVar38,0xfff30004,3);
  uStack_4f0 = auVar38._0_8_;
  uStack_4e8 = auVar38._8_8_;
  auVar38 = vpinsrd_avx(ZEXT416(0xffe30015),0xffe30015,1);
  auVar38 = vpinsrd_avx(auVar38,0xffe30015,2);
  auVar38 = vpinsrd_avx(auVar38,0xffe30015,3);
  auVar39 = vpinsrd_avx(ZEXT416(0xffe30015),0xffe30015,1);
  auVar39 = vpinsrd_avx(auVar39,0xffe30015,2);
  auVar39 = vpinsrd_avx(auVar39,0xffe30015,3);
  uStack_4b0 = auVar39._0_8_;
  uStack_4a8 = auVar39._8_8_;
  auVar39 = vpinsrd_avx(ZEXT416(0xffd80023),0xffd80023,1);
  auVar39 = vpinsrd_avx(auVar39,0xffd80023,2);
  auVar39 = vpinsrd_avx(auVar39,0xffd80023,3);
  auVar40 = vpinsrd_avx(ZEXT416(0xffd80023),0xffd80023,1);
  auVar40 = vpinsrd_avx(auVar40,0xffd80023,2);
  auVar40 = vpinsrd_avx(auVar40,0xffd80023,3);
  uStack_470 = auVar40._0_8_;
  uStack_468 = auVar40._8_8_;
  auVar40 = vpinsrd_avx(ZEXT416(0xffd3002b),0xffd3002b,1);
  auVar40 = vpinsrd_avx(auVar40,0xffd3002b,2);
  auVar40 = vpinsrd_avx(auVar40,0xffd3002b,3);
  auVar41 = vpinsrd_avx(ZEXT416(0xffd3002b),0xffd3002b,1);
  auVar41 = vpinsrd_avx(auVar41,0xffd3002b,2);
  auVar41 = vpinsrd_avx(auVar41,0xffd3002b,3);
  uStack_430 = auVar41._0_8_;
  uStack_428 = auVar41._8_8_;
  auVar41 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar41 = vpinsrd_avx(auVar41,0x26002c,2);
  auVar41 = vpinsrd_avx(auVar41,0x26002c,3);
  auVar42 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar42 = vpinsrd_avx(auVar42,0x26002c,2);
  auVar42 = vpinsrd_avx(auVar42,0x26002c,3);
  uStack_3f0 = auVar42._0_8_;
  uStack_3e8 = auVar42._8_8_;
  auVar42 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar42 = vpinsrd_avx(auVar42,0x90019,2);
  auVar42 = vpinsrd_avx(auVar42,0x90019,3);
  auVar43 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar43 = vpinsrd_avx(auVar43,0x90019,2);
  auVar43 = vpinsrd_avx(auVar43,0x90019,3);
  uStack_3b0 = auVar43._0_8_;
  uStack_3a8 = auVar43._8_8_;
  auVar43 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar43 = vpinsrd_avx(auVar43,0xfff70026,2);
  auVar43 = vpinsrd_avx(auVar43,0xfff70026,3);
  auVar44 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar44 = vpinsrd_avx(auVar44,0xfff70026,2);
  auVar44 = vpinsrd_avx(auVar44,0xfff70026,3);
  uStack_370 = auVar44._0_8_;
  uStack_368 = auVar44._8_8_;
  auVar44 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar44 = vpinsrd_avx(auVar44,0xffe7ffd4,2);
  auVar44 = vpinsrd_avx(auVar44,0xffe7ffd4,3);
  auVar45 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar45 = vpinsrd_avx(auVar45,0xffe7ffd4,2);
  auVar45 = vpinsrd_avx(auVar45,0xffe7ffd4,3);
  uStack_330 = auVar45._0_8_;
  uStack_328 = auVar45._8_8_;
  auVar45 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar45 = vpinsrd_avx(auVar45,0xffd40019,2);
  auVar45 = vpinsrd_avx(auVar45,0xffd40019,3);
  auVar46 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar46 = vpinsrd_avx(auVar46,0xffd40019,2);
  auVar46 = vpinsrd_avx(auVar46,0xffd40019,3);
  uStack_2f0 = auVar46._0_8_;
  uStack_2e8 = auVar46._8_8_;
  auVar46 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar46 = vpinsrd_avx(auVar46,0x260009,2);
  auVar46 = vpinsrd_avx(auVar46,0x260009,3);
  auVar47 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar47 = vpinsrd_avx(auVar47,0x260009,2);
  auVar47 = vpinsrd_avx(auVar47,0x260009,3);
  uStack_2b0 = auVar47._0_8_;
  uStack_2a8 = auVar47._8_8_;
  auVar47 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar47 = vpinsrd_avx(auVar47,0xffe70009,2);
  auVar47 = vpinsrd_avx(auVar47,0xffe70009,3);
  auVar48 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar48 = vpinsrd_avx(auVar48,0xffe70009,2);
  auVar48 = vpinsrd_avx(auVar48,0xffe70009,3);
  uStack_270 = auVar48._0_8_;
  uStack_268 = auVar48._8_8_;
  auVar48 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar48 = vpinsrd_avx(auVar48,0xffd40026,2);
  auVar48 = vpinsrd_avx(auVar48,0xffd40026,3);
  auVar49 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar49 = vpinsrd_avx(auVar49,0xffd40026,2);
  auVar49 = vpinsrd_avx(auVar49,0xffd40026,3);
  uStack_230 = auVar49._0_8_;
  uStack_228 = auVar49._8_8_;
  auVar49 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar49 = vpinsrd_avx(auVar49,0x11002a,2);
  auVar49 = vpinsrd_avx(auVar49,0x11002a,3);
  auVar50 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar50 = vpinsrd_avx(auVar50,0x11002a,2);
  auVar50 = vpinsrd_avx(auVar50,0x11002a,3);
  uStack_1f0 = auVar50._0_8_;
  uStack_1e8 = auVar50._8_8_;
  auVar50 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar50 = vpinsrd_avx(auVar50,0xffd60011,2);
  auVar50 = vpinsrd_avx(auVar50,0xffd60011,3);
  auVar51 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar51 = vpinsrd_avx(auVar51,0xffd60011,2);
  auVar51 = vpinsrd_avx(auVar51,0xffd60011,3);
  uStack_1b0 = auVar51._0_8_;
  uStack_1a8 = auVar51._8_8_;
  auVar51 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar51 = vpinsrd_avx(auVar51,0xffe00020,2);
  auVar51 = vpinsrd_avx(auVar51,0xffe00020,3);
  auVar52 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar52 = vpinsrd_avx(auVar52,0xffe00020,2);
  auVar52 = vpinsrd_avx(auVar52,0xffe00020,3);
  uStack_170 = auVar52._0_8_;
  uStack_168 = auVar52._8_8_;
  auVar52 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar52 = vpinsrd_avx(auVar52,0x200020,2);
  auVar52 = vpinsrd_avx(auVar52,0x200020,3);
  auVar174 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar174 = vpinsrd_avx(auVar174,0x200020,2);
  auVar174 = vpinsrd_avx(auVar174,0x200020,3);
  uStack_130 = auVar174._0_8_;
  uStack_128 = auVar174._8_8_;
  local_3cf8 = (char)in_R8D;
  uVar170 = 1 << (local_3cf8 - 1U & 0x1f);
  auVar174 = vpinsrd_avx(ZEXT416(uVar170),uVar170,1);
  auVar174 = vpinsrd_avx(auVar174,uVar170,2);
  auVar174 = vpinsrd_avx(auVar174,uVar170,3);
  auVar172 = vpinsrd_avx(ZEXT416(uVar170),uVar170,1);
  auVar172 = vpinsrd_avx(auVar172,uVar170,2);
  auVar172 = vpinsrd_avx(auVar172,uVar170,3);
  auVar172 = ZEXT116(0) * auVar174 + ZEXT116(1) * auVar172;
  auVar174 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar174;
  uStack_f0 = auVar174._0_8_;
  uStack_e8 = auVar174._8_8_;
  local_3cf0 = in_RDX;
  for (local_4284 = 0; local_4284 < in_ECX; local_4284 = local_4284 + 8) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI + local_4284) * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 3 + local_4284) * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 5 + local_4284) * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 7 + local_4284) * 2);
    pauVar5 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 9 + local_4284) * 2);
    pauVar6 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xb + local_4284) * 2);
    pauVar7 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xd + local_4284) * 2);
    pauVar8 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xf + local_4284) * 2);
    auVar54 = vpunpcklwd_avx(*pauVar1,*pauVar2);
    auVar55 = vpunpcklwd_avx(*pauVar3,*pauVar4);
    auVar56 = vpunpcklwd_avx(*pauVar5,*pauVar6);
    auVar57 = vpunpcklwd_avx(*pauVar7,*pauVar8);
    auVar174 = vpunpckhwd_avx(*pauVar1,*pauVar2);
    auVar175 = vpunpckhwd_avx(*pauVar3,*pauVar4);
    auVar173 = vpunpckhwd_avx(*pauVar5,*pauVar6);
    auVar53 = vpunpckhwd_avx(*pauVar7,*pauVar8);
    local_4410 = auVar174._0_8_;
    uStack_4408 = auVar174._8_8_;
    local_4420 = auVar175._0_8_;
    uStack_4418 = auVar175._8_8_;
    local_4430 = auVar173._0_8_;
    uStack_4428 = auVar173._8_8_;
    local_4440 = auVar53._0_8_;
    uStack_4438 = auVar53._8_8_;
    auVar145._16_8_ = local_4410;
    auVar145._0_16_ = auVar54;
    auVar145._24_8_ = uStack_4408;
    auVar61._16_8_ = uStack_bf0;
    auVar61._0_16_ = auVar9;
    auVar61._24_8_ = uStack_be8;
    auVar61 = vpmaddwd_avx2(auVar145,auVar61);
    auVar144._16_8_ = local_4420;
    auVar144._0_16_ = auVar55;
    auVar144._24_8_ = uStack_4418;
    auVar143._16_8_ = uStack_bb0;
    auVar143._0_16_ = auVar10;
    auVar143._24_8_ = uStack_ba8;
    auVar62 = vpmaddwd_avx2(auVar144,auVar143);
    auVar142._16_8_ = local_4430;
    auVar142._0_16_ = auVar56;
    auVar142._24_8_ = uStack_4428;
    auVar141._16_8_ = uStack_b70;
    auVar141._0_16_ = auVar11;
    auVar141._24_8_ = uStack_b68;
    auVar63 = vpmaddwd_avx2(auVar142,auVar141);
    auVar140._16_8_ = local_4440;
    auVar140._0_16_ = auVar57;
    auVar140._24_8_ = uStack_4438;
    auVar139._16_8_ = uStack_b30;
    auVar139._0_16_ = auVar12;
    auVar139._24_8_ = uStack_b28;
    auVar64 = vpmaddwd_avx2(auVar140,auVar139);
    auVar61 = vpaddd_avx2(auVar61,auVar62);
    auVar62 = vpaddd_avx2(auVar63,auVar64);
    auVar61 = vpaddd_avx2(auVar61,auVar62);
    auVar138._16_8_ = local_4410;
    auVar138._0_16_ = auVar54;
    auVar138._24_8_ = uStack_4408;
    auVar62._16_8_ = uStack_af0;
    auVar62._0_16_ = auVar13;
    auVar62._24_8_ = uStack_ae8;
    auVar62 = vpmaddwd_avx2(auVar138,auVar62);
    auVar137._16_8_ = local_4420;
    auVar137._0_16_ = auVar55;
    auVar137._24_8_ = uStack_4418;
    auVar136._16_8_ = uStack_ab0;
    auVar136._0_16_ = auVar14;
    auVar136._24_8_ = uStack_aa8;
    auVar63 = vpmaddwd_avx2(auVar137,auVar136);
    auVar135._16_8_ = local_4430;
    auVar135._0_16_ = auVar56;
    auVar135._24_8_ = uStack_4428;
    auVar134._16_8_ = uStack_a70;
    auVar134._0_16_ = auVar15;
    auVar134._24_8_ = uStack_a68;
    auVar64 = vpmaddwd_avx2(auVar135,auVar134);
    auVar133._16_8_ = local_4440;
    auVar133._0_16_ = auVar57;
    auVar133._24_8_ = uStack_4438;
    auVar132._16_8_ = uStack_a30;
    auVar132._0_16_ = auVar16;
    auVar132._24_8_ = uStack_a28;
    auVar65 = vpmaddwd_avx2(auVar133,auVar132);
    auVar62 = vpaddd_avx2(auVar62,auVar63);
    auVar63 = vpaddd_avx2(auVar64,auVar65);
    auVar62 = vpaddd_avx2(auVar62,auVar63);
    auVar131._16_8_ = local_4410;
    auVar131._0_16_ = auVar54;
    auVar131._24_8_ = uStack_4408;
    auVar63._16_8_ = uStack_9f0;
    auVar63._0_16_ = auVar17;
    auVar63._24_8_ = uStack_9e8;
    auVar63 = vpmaddwd_avx2(auVar131,auVar63);
    auVar130._16_8_ = local_4420;
    auVar130._0_16_ = auVar55;
    auVar130._24_8_ = uStack_4418;
    auVar129._16_8_ = uStack_9b0;
    auVar129._0_16_ = auVar18;
    auVar129._24_8_ = uStack_9a8;
    auVar64 = vpmaddwd_avx2(auVar130,auVar129);
    auVar128._16_8_ = local_4430;
    auVar128._0_16_ = auVar56;
    auVar128._24_8_ = uStack_4428;
    auVar127._16_8_ = uStack_970;
    auVar127._0_16_ = auVar19;
    auVar127._24_8_ = uStack_968;
    auVar65 = vpmaddwd_avx2(auVar128,auVar127);
    auVar126._16_8_ = local_4440;
    auVar126._0_16_ = auVar57;
    auVar126._24_8_ = uStack_4438;
    auVar125._16_8_ = uStack_930;
    auVar125._0_16_ = auVar20;
    auVar125._24_8_ = uStack_928;
    auVar66 = vpmaddwd_avx2(auVar126,auVar125);
    auVar63 = vpaddd_avx2(auVar63,auVar64);
    auVar64 = vpaddd_avx2(auVar65,auVar66);
    auVar63 = vpaddd_avx2(auVar63,auVar64);
    auVar124._16_8_ = local_4410;
    auVar124._0_16_ = auVar54;
    auVar124._24_8_ = uStack_4408;
    auVar64._16_8_ = uStack_8f0;
    auVar64._0_16_ = auVar21;
    auVar64._24_8_ = uStack_8e8;
    auVar64 = vpmaddwd_avx2(auVar124,auVar64);
    auVar123._16_8_ = local_4420;
    auVar123._0_16_ = auVar55;
    auVar123._24_8_ = uStack_4418;
    auVar122._16_8_ = uStack_8b0;
    auVar122._0_16_ = auVar22;
    auVar122._24_8_ = uStack_8a8;
    auVar65 = vpmaddwd_avx2(auVar123,auVar122);
    auVar121._16_8_ = local_4430;
    auVar121._0_16_ = auVar56;
    auVar121._24_8_ = uStack_4428;
    auVar120._16_8_ = uStack_870;
    auVar120._0_16_ = auVar23;
    auVar120._24_8_ = uStack_868;
    auVar66 = vpmaddwd_avx2(auVar121,auVar120);
    auVar119._16_8_ = local_4440;
    auVar119._0_16_ = auVar57;
    auVar119._24_8_ = uStack_4438;
    auVar118._16_8_ = uStack_830;
    auVar118._0_16_ = auVar24;
    auVar118._24_8_ = uStack_828;
    auVar67 = vpmaddwd_avx2(auVar119,auVar118);
    auVar64 = vpaddd_avx2(auVar64,auVar65);
    auVar65 = vpaddd_avx2(auVar66,auVar67);
    auVar64 = vpaddd_avx2(auVar64,auVar65);
    auVar117._16_8_ = local_4410;
    auVar117._0_16_ = auVar54;
    auVar117._24_8_ = uStack_4408;
    auVar65._16_8_ = uStack_7f0;
    auVar65._0_16_ = auVar25;
    auVar65._24_8_ = uStack_7e8;
    auVar65 = vpmaddwd_avx2(auVar117,auVar65);
    auVar116._16_8_ = local_4420;
    auVar116._0_16_ = auVar55;
    auVar116._24_8_ = uStack_4418;
    auVar115._16_8_ = uStack_7b0;
    auVar115._0_16_ = auVar26;
    auVar115._24_8_ = uStack_7a8;
    auVar66 = vpmaddwd_avx2(auVar116,auVar115);
    auVar114._16_8_ = local_4430;
    auVar114._0_16_ = auVar56;
    auVar114._24_8_ = uStack_4428;
    auVar113._16_8_ = uStack_770;
    auVar113._0_16_ = auVar27;
    auVar113._24_8_ = uStack_768;
    auVar67 = vpmaddwd_avx2(auVar114,auVar113);
    auVar112._16_8_ = local_4440;
    auVar112._0_16_ = auVar57;
    auVar112._24_8_ = uStack_4438;
    auVar111._16_8_ = uStack_730;
    auVar111._0_16_ = auVar28;
    auVar111._24_8_ = uStack_728;
    auVar68 = vpmaddwd_avx2(auVar112,auVar111);
    auVar65 = vpaddd_avx2(auVar65,auVar66);
    auVar66 = vpaddd_avx2(auVar67,auVar68);
    auVar65 = vpaddd_avx2(auVar65,auVar66);
    auVar110._16_8_ = local_4410;
    auVar110._0_16_ = auVar54;
    auVar110._24_8_ = uStack_4408;
    auVar66._16_8_ = uStack_6f0;
    auVar66._0_16_ = auVar29;
    auVar66._24_8_ = uStack_6e8;
    auVar66 = vpmaddwd_avx2(auVar110,auVar66);
    auVar109._16_8_ = local_4420;
    auVar109._0_16_ = auVar55;
    auVar109._24_8_ = uStack_4418;
    auVar108._16_8_ = uStack_6b0;
    auVar108._0_16_ = auVar30;
    auVar108._24_8_ = uStack_6a8;
    auVar67 = vpmaddwd_avx2(auVar109,auVar108);
    auVar107._16_8_ = local_4430;
    auVar107._0_16_ = auVar56;
    auVar107._24_8_ = uStack_4428;
    auVar106._16_8_ = uStack_670;
    auVar106._0_16_ = auVar31;
    auVar106._24_8_ = uStack_668;
    auVar68 = vpmaddwd_avx2(auVar107,auVar106);
    auVar105._16_8_ = local_4440;
    auVar105._0_16_ = auVar57;
    auVar105._24_8_ = uStack_4438;
    auVar104._16_8_ = uStack_630;
    auVar104._0_16_ = auVar32;
    auVar104._24_8_ = uStack_628;
    auVar69 = vpmaddwd_avx2(auVar105,auVar104);
    auVar66 = vpaddd_avx2(auVar66,auVar67);
    auVar67 = vpaddd_avx2(auVar68,auVar69);
    auVar66 = vpaddd_avx2(auVar66,auVar67);
    auVar103._16_8_ = local_4410;
    auVar103._0_16_ = auVar54;
    auVar103._24_8_ = uStack_4408;
    auVar67._16_8_ = uStack_5f0;
    auVar67._0_16_ = auVar33;
    auVar67._24_8_ = uStack_5e8;
    auVar67 = vpmaddwd_avx2(auVar103,auVar67);
    auVar102._16_8_ = local_4420;
    auVar102._0_16_ = auVar55;
    auVar102._24_8_ = uStack_4418;
    auVar101._16_8_ = uStack_5b0;
    auVar101._0_16_ = auVar34;
    auVar101._24_8_ = uStack_5a8;
    auVar68 = vpmaddwd_avx2(auVar102,auVar101);
    auVar100._16_8_ = local_4430;
    auVar100._0_16_ = auVar56;
    auVar100._24_8_ = uStack_4428;
    auVar99._16_8_ = uStack_570;
    auVar99._0_16_ = auVar35;
    auVar99._24_8_ = uStack_568;
    auVar69 = vpmaddwd_avx2(auVar100,auVar99);
    auVar98._16_8_ = local_4440;
    auVar98._0_16_ = auVar57;
    auVar98._24_8_ = uStack_4438;
    auVar97._16_8_ = uStack_530;
    auVar97._0_16_ = auVar36;
    auVar97._24_8_ = uStack_528;
    auVar70 = vpmaddwd_avx2(auVar98,auVar97);
    auVar67 = vpaddd_avx2(auVar67,auVar68);
    auVar68 = vpaddd_avx2(auVar69,auVar70);
    auVar67 = vpaddd_avx2(auVar67,auVar68);
    auVar96._16_8_ = local_4410;
    auVar96._0_16_ = auVar54;
    auVar96._24_8_ = uStack_4408;
    auVar68._16_8_ = uStack_4f0;
    auVar68._0_16_ = auVar37;
    auVar68._24_8_ = uStack_4e8;
    auVar68 = vpmaddwd_avx2(auVar96,auVar68);
    auVar95._16_8_ = local_4420;
    auVar95._0_16_ = auVar55;
    auVar95._24_8_ = uStack_4418;
    auVar94._16_8_ = uStack_4b0;
    auVar94._0_16_ = auVar38;
    auVar94._24_8_ = uStack_4a8;
    auVar69 = vpmaddwd_avx2(auVar95,auVar94);
    auVar93._16_8_ = local_4430;
    auVar93._0_16_ = auVar56;
    auVar93._24_8_ = uStack_4428;
    auVar92._16_8_ = uStack_470;
    auVar92._0_16_ = auVar39;
    auVar92._24_8_ = uStack_468;
    auVar70 = vpmaddwd_avx2(auVar93,auVar92);
    auVar91._16_8_ = local_4440;
    auVar91._0_16_ = auVar57;
    auVar91._24_8_ = uStack_4438;
    auVar90._16_8_ = uStack_430;
    auVar90._0_16_ = auVar40;
    auVar90._24_8_ = uStack_428;
    auVar71 = vpmaddwd_avx2(auVar91,auVar90);
    auVar68 = vpaddd_avx2(auVar68,auVar69);
    auVar69 = vpaddd_avx2(auVar70,auVar71);
    auVar68 = vpaddd_avx2(auVar68,auVar69);
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_4284 * 2);
    pauVar2 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 2) * 2);
    pauVar3 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 4) * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 6) * 2);
    pauVar5 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 8) * 2);
    pauVar6 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 10) * 2);
    pauVar7 = (undefined1 (*) [16])(in_RDI + (long)(local_4284 + in_ESI * 0xc) * 2);
    pauVar8 = (undefined1 (*) [16])(in_RDI + (long)(in_ESI * 0xe + local_4284) * 2);
    auVar54 = vpunpcklwd_avx(*pauVar2,*pauVar4);
    auVar55 = vpunpcklwd_avx(*pauVar6,*pauVar8);
    auVar56 = vpunpcklwd_avx(*pauVar3,*pauVar7);
    auVar57 = vpunpcklwd_avx(*pauVar1,*pauVar5);
    auVar174 = vpunpckhwd_avx(*pauVar2,*pauVar4);
    auVar175 = vpunpckhwd_avx(*pauVar6,*pauVar8);
    auVar173 = vpunpckhwd_avx(*pauVar3,*pauVar7);
    auVar53 = vpunpckhwd_avx(*pauVar1,*pauVar5);
    local_4410 = auVar174._0_8_;
    uStack_4408 = auVar174._8_8_;
    local_4420 = auVar175._0_8_;
    uStack_4418 = auVar175._8_8_;
    local_4430 = auVar173._0_8_;
    uStack_4428 = auVar173._8_8_;
    local_4440 = auVar53._0_8_;
    uStack_4438 = auVar53._8_8_;
    auVar89._16_8_ = local_4410;
    auVar89._0_16_ = auVar54;
    auVar89._24_8_ = uStack_4408;
    auVar69._16_8_ = uStack_3f0;
    auVar69._0_16_ = auVar41;
    auVar69._24_8_ = uStack_3e8;
    auVar69 = vpmaddwd_avx2(auVar89,auVar69);
    auVar88._16_8_ = local_4420;
    auVar88._0_16_ = auVar55;
    auVar88._24_8_ = uStack_4418;
    auVar87._16_8_ = uStack_3b0;
    auVar87._0_16_ = auVar42;
    auVar87._24_8_ = uStack_3a8;
    auVar70 = vpmaddwd_avx2(auVar88,auVar87);
    auVar69 = vpaddd_avx2(auVar69,auVar70);
    auVar86._16_8_ = local_4410;
    auVar86._0_16_ = auVar54;
    auVar86._24_8_ = uStack_4408;
    auVar70._16_8_ = uStack_370;
    auVar70._0_16_ = auVar43;
    auVar70._24_8_ = uStack_368;
    auVar70 = vpmaddwd_avx2(auVar86,auVar70);
    auVar85._16_8_ = local_4420;
    auVar85._0_16_ = auVar55;
    auVar85._24_8_ = uStack_4418;
    auVar84._16_8_ = uStack_330;
    auVar84._0_16_ = auVar44;
    auVar84._24_8_ = uStack_328;
    auVar71 = vpmaddwd_avx2(auVar85,auVar84);
    auVar70 = vpaddd_avx2(auVar70,auVar71);
    auVar83._16_8_ = local_4410;
    auVar83._0_16_ = auVar54;
    auVar83._24_8_ = uStack_4408;
    auVar71._16_8_ = uStack_2f0;
    auVar71._0_16_ = auVar45;
    auVar71._24_8_ = uStack_2e8;
    auVar71 = vpmaddwd_avx2(auVar83,auVar71);
    auVar82._16_8_ = local_4420;
    auVar82._0_16_ = auVar55;
    auVar82._24_8_ = uStack_4418;
    auVar60._16_8_ = uStack_2b0;
    auVar60._0_16_ = auVar46;
    auVar60._24_8_ = uStack_2a8;
    auVar72 = vpmaddwd_avx2(auVar82,auVar60);
    auVar71 = vpaddd_avx2(auVar71,auVar72);
    auVar59._16_8_ = local_4410;
    auVar59._0_16_ = auVar54;
    auVar59._24_8_ = uStack_4408;
    auVar72._16_8_ = uStack_270;
    auVar72._0_16_ = auVar47;
    auVar72._24_8_ = uStack_268;
    auVar72 = vpmaddwd_avx2(auVar59,auVar72);
    auVar81._16_8_ = local_4420;
    auVar81._0_16_ = auVar55;
    auVar81._24_8_ = uStack_4418;
    auVar80._16_8_ = uStack_230;
    auVar80._0_16_ = auVar48;
    auVar80._24_8_ = uStack_228;
    auVar73 = vpmaddwd_avx2(auVar81,auVar80);
    auVar72 = vpaddd_avx2(auVar72,auVar73);
    auVar79._16_8_ = local_4430;
    auVar79._0_16_ = auVar56;
    auVar79._24_8_ = uStack_4428;
    auVar74._16_8_ = uStack_1f0;
    auVar74._0_16_ = auVar49;
    auVar74._24_8_ = uStack_1e8;
    auVar74 = vpmaddwd_avx2(auVar79,auVar74);
    auVar78._16_8_ = local_4430;
    auVar78._0_16_ = auVar56;
    auVar78._24_8_ = uStack_4428;
    auVar75._16_8_ = uStack_1b0;
    auVar75._0_16_ = auVar50;
    auVar75._24_8_ = uStack_1a8;
    auVar75 = vpmaddwd_avx2(auVar78,auVar75);
    auVar77._16_8_ = local_4440;
    auVar77._0_16_ = auVar57;
    auVar77._24_8_ = uStack_4438;
    auVar76._16_8_ = uStack_130;
    auVar76._0_16_ = auVar52;
    auVar76._24_8_ = uStack_128;
    auVar76 = vpmaddwd_avx2(auVar77,auVar76);
    auVar58._16_8_ = local_4440;
    auVar58._0_16_ = auVar57;
    auVar58._24_8_ = uStack_4438;
    auVar73._16_8_ = uStack_170;
    auVar73._0_16_ = auVar51;
    auVar73._24_8_ = uStack_168;
    auVar77 = vpmaddwd_avx2(auVar58,auVar73);
    auVar73 = vpaddd_avx2(auVar76,auVar74);
    auVar58 = vpaddd_avx2(auVar77,auVar75);
    auVar78 = vpsubd_avx2(auVar76,auVar74);
    auVar79 = vpsubd_avx2(auVar77,auVar75);
    auVar74 = vpaddd_avx2(auVar73,auVar69);
    auVar75 = vpaddd_avx2(auVar58,auVar70);
    auVar76 = vpaddd_avx2(auVar79,auVar71);
    auVar77 = vpaddd_avx2(auVar78,auVar72);
    auVar80 = vpsubd_avx2(auVar73,auVar69);
    auVar81 = vpsubd_avx2(auVar58,auVar70);
    auVar58 = vpsubd_avx2(auVar79,auVar71);
    auVar73 = vpsubd_avx2(auVar78,auVar72);
    auVar153._16_8_ = uStack_f0;
    auVar153._0_16_ = auVar172;
    auVar153._24_8_ = uStack_e8;
    auVar69 = vpaddd_avx2(auVar74,auVar153);
    auVar152._16_8_ = uStack_f0;
    auVar152._0_16_ = auVar172;
    auVar152._24_8_ = uStack_e8;
    auVar70 = vpaddd_avx2(auVar75,auVar152);
    auVar151._16_8_ = uStack_f0;
    auVar151._0_16_ = auVar172;
    auVar151._24_8_ = uStack_e8;
    auVar71 = vpaddd_avx2(auVar76,auVar151);
    auVar150._16_8_ = uStack_f0;
    auVar150._0_16_ = auVar172;
    auVar150._24_8_ = uStack_e8;
    auVar72 = vpaddd_avx2(auVar77,auVar150);
    auVar149._16_8_ = uStack_f0;
    auVar149._0_16_ = auVar172;
    auVar149._24_8_ = uStack_e8;
    auVar73 = vpaddd_avx2(auVar73,auVar149);
    auVar148._16_8_ = uStack_f0;
    auVar148._0_16_ = auVar172;
    auVar148._24_8_ = uStack_e8;
    auVar58 = vpaddd_avx2(auVar58,auVar148);
    auVar147._16_8_ = uStack_f0;
    auVar147._0_16_ = auVar172;
    auVar147._24_8_ = uStack_e8;
    auVar74 = vpaddd_avx2(auVar81,auVar147);
    auVar146._16_8_ = uStack_f0;
    auVar146._0_16_ = auVar172;
    auVar146._24_8_ = uStack_e8;
    auVar75 = vpaddd_avx2(auVar80,auVar146);
    auVar76 = vpaddd_avx2(auVar69,auVar61);
    auVar77 = vpaddd_avx2(auVar70,auVar62);
    auVar78 = vpaddd_avx2(auVar71,auVar63);
    auVar79 = vpaddd_avx2(auVar72,auVar64);
    auVar80 = vpaddd_avx2(auVar73,auVar65);
    auVar81 = vpaddd_avx2(auVar58,auVar66);
    auVar59 = vpaddd_avx2(auVar74,auVar67);
    auVar60 = vpaddd_avx2(auVar75,auVar68);
    auVar82 = vpsubd_avx2(auVar69,auVar61);
    auVar83 = vpsubd_avx2(auVar70,auVar62);
    auVar84 = vpsubd_avx2(auVar71,auVar63);
    auVar85 = vpsubd_avx2(auVar72,auVar64);
    auVar72 = vpsubd_avx2(auVar73,auVar65);
    auVar71 = vpsubd_avx2(auVar58,auVar66);
    auVar70 = vpsubd_avx2(auVar74,auVar67);
    auVar69 = vpsubd_avx2(auVar75,auVar68);
    auVar61 = vpsrad_avx2(auVar76,ZEXT416(in_R8D));
    auVar62 = vpsrad_avx2(auVar77,ZEXT416(in_R8D));
    auVar63 = vpsrad_avx2(auVar78,ZEXT416(in_R8D));
    auVar64 = vpsrad_avx2(auVar79,ZEXT416(in_R8D));
    auVar65 = vpsrad_avx2(auVar80,ZEXT416(in_R8D));
    auVar66 = vpsrad_avx2(auVar81,ZEXT416(in_R8D));
    auVar67 = vpsrad_avx2(auVar59,ZEXT416(in_R8D));
    auVar68 = vpsrad_avx2(auVar60,ZEXT416(in_R8D));
    auVar69 = vpsrad_avx2(auVar69,ZEXT416(in_R8D));
    auVar70 = vpsrad_avx2(auVar70,ZEXT416(in_R8D));
    auVar71 = vpsrad_avx2(auVar71,ZEXT416(in_R8D));
    auVar72 = vpsrad_avx2(auVar72,ZEXT416(in_R8D));
    auVar73 = vpsrad_avx2(auVar85,ZEXT416(in_R8D));
    auVar58 = vpsrad_avx2(auVar84,ZEXT416(in_R8D));
    auVar74 = vpsrad_avx2(auVar83,ZEXT416(in_R8D));
    auVar75 = vpsrad_avx2(auVar82,ZEXT416(in_R8D));
    auVar61 = vpackssdw_avx2(auVar61,auVar65);
    auVar62 = vpackssdw_avx2(auVar62,auVar66);
    auVar63 = vpackssdw_avx2(auVar63,auVar67);
    auVar64 = vpackssdw_avx2(auVar64,auVar68);
    auVar65 = vpunpcklwd_avx2(auVar61,auVar63);
    auVar61 = vpunpckhwd_avx2(auVar61,auVar63);
    auVar63 = vpunpcklwd_avx2(auVar62,auVar64);
    auVar62 = vpunpckhwd_avx2(auVar62,auVar64);
    auVar64 = vpunpcklwd_avx2(auVar65,auVar63);
    auVar63 = vpunpckhwd_avx2(auVar65,auVar63);
    auVar65 = vpunpcklwd_avx2(auVar61,auVar62);
    auVar61 = vpunpckhwd_avx2(auVar61,auVar62);
    auVar68 = vpunpcklqdq_avx2(auVar64,auVar65);
    auVar65 = vpunpckhqdq_avx2(auVar64,auVar65);
    auVar76 = vpunpcklqdq_avx2(auVar63,auVar61);
    auVar66 = vpunpckhqdq_avx2(auVar63,auVar61);
    auVar61 = vpackssdw_avx2(auVar69,auVar73);
    auVar62 = vpackssdw_avx2(auVar70,auVar58);
    auVar63 = vpackssdw_avx2(auVar71,auVar74);
    auVar64 = vpackssdw_avx2(auVar72,auVar75);
    auVar67 = vpunpcklwd_avx2(auVar61,auVar63);
    auVar61 = vpunpckhwd_avx2(auVar61,auVar63);
    auVar63 = vpunpcklwd_avx2(auVar62,auVar64);
    auVar62 = vpunpckhwd_avx2(auVar62,auVar64);
    auVar64 = vpunpcklwd_avx2(auVar67,auVar63);
    auVar63 = vpunpckhwd_avx2(auVar67,auVar63);
    auVar67 = vpunpcklwd_avx2(auVar61,auVar62);
    auVar61 = vpunpckhwd_avx2(auVar61,auVar62);
    auVar69 = vpunpcklqdq_avx2(auVar64,auVar67);
    auVar62 = vpunpckhqdq_avx2(auVar64,auVar67);
    auVar64 = vpunpcklqdq_avx2(auVar63,auVar61);
    auVar61 = vpunpckhqdq_avx2(auVar63,auVar61);
    local_4460 = vperm2i128_avx2(auVar68,auVar69,0x20);
    local_4480 = vperm2i128_avx2(auVar65,auVar62,0x20);
    local_44a0 = vperm2i128_avx2(auVar76,auVar64,0x20);
    local_44c0 = vperm2i128_avx2(auVar66,auVar61,0x20);
    local_44e0 = vperm2i128_avx2(auVar68,auVar69,0x31);
    local_4500 = vperm2i128_avx2(auVar65,auVar62,0x31);
    local_4520 = vperm2i128_avx2(auVar76,auVar64,0x31);
    local_4540 = vperm2i128_avx2(auVar66,auVar61,0x31);
    if (in_R9D != 0xf) {
      local_3cfc = (byte)in_R9D;
      uVar171 = (short)(1 << (local_3cfc & 0x1f)) - 1;
      auVar174 = vpinsrw_avx(ZEXT216(uVar171),(uint)uVar171,1);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,2);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,3);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,4);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,5);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,6);
      auVar174 = vpinsrw_avx(auVar174,(uint)uVar171,7);
      auVar175 = vpinsrw_avx(ZEXT216(uVar171),(uint)uVar171,1);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,2);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,3);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,4);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,5);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,6);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,7);
      uStack_b0 = auVar175._0_8_;
      uStack_a8 = auVar175._8_8_;
      uVar171 = -(short)(1 << (local_3cfc & 0x1f));
      auVar175 = vpinsrw_avx(ZEXT216(uVar171),(uint)uVar171,1);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,2);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,3);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,4);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,5);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,6);
      auVar175 = vpinsrw_avx(auVar175,(uint)uVar171,7);
      auVar173 = vpinsrw_avx(ZEXT216(uVar171),(uint)uVar171,1);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,2);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,3);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,4);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,5);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,6);
      auVar173 = vpinsrw_avx(auVar173,(uint)uVar171,7);
      auVar173 = ZEXT116(0) * auVar175 + ZEXT116(1) * auVar173;
      auVar175 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar175;
      uStack_70 = auVar175._0_8_;
      uStack_68 = auVar175._8_8_;
      auVar161._16_8_ = uStack_b0;
      auVar161._0_16_ = auVar174;
      auVar161._24_8_ = uStack_a8;
      auVar61 = vpminsw_avx2(local_4460,auVar161);
      auVar160._16_8_ = uStack_b0;
      auVar160._0_16_ = auVar174;
      auVar160._24_8_ = uStack_a8;
      auVar62 = vpminsw_avx2(local_4480,auVar160);
      auVar159._16_8_ = uStack_b0;
      auVar159._0_16_ = auVar174;
      auVar159._24_8_ = uStack_a8;
      auVar63 = vpminsw_avx2(local_44a0,auVar159);
      auVar158._16_8_ = uStack_b0;
      auVar158._0_16_ = auVar174;
      auVar158._24_8_ = uStack_a8;
      auVar64 = vpminsw_avx2(local_44c0,auVar158);
      auVar157._16_8_ = uStack_b0;
      auVar157._0_16_ = auVar174;
      auVar157._24_8_ = uStack_a8;
      auVar65 = vpminsw_avx2(local_44e0,auVar157);
      auVar156._16_8_ = uStack_b0;
      auVar156._0_16_ = auVar174;
      auVar156._24_8_ = uStack_a8;
      auVar66 = vpminsw_avx2(local_4500,auVar156);
      auVar155._16_8_ = uStack_b0;
      auVar155._0_16_ = auVar174;
      auVar155._24_8_ = uStack_a8;
      auVar67 = vpminsw_avx2(local_4520,auVar155);
      auVar154._16_8_ = uStack_b0;
      auVar154._0_16_ = auVar174;
      auVar154._24_8_ = uStack_a8;
      auVar68 = vpminsw_avx2(local_4540,auVar154);
      auVar169._16_8_ = uStack_70;
      auVar169._0_16_ = auVar173;
      auVar169._24_8_ = uStack_68;
      local_4460 = vpmaxsw_avx2(auVar61,auVar169);
      auVar168._16_8_ = uStack_70;
      auVar168._0_16_ = auVar173;
      auVar168._24_8_ = uStack_68;
      local_4480 = vpmaxsw_avx2(auVar62,auVar168);
      auVar167._16_8_ = uStack_70;
      auVar167._0_16_ = auVar173;
      auVar167._24_8_ = uStack_68;
      local_44a0 = vpmaxsw_avx2(auVar63,auVar167);
      auVar166._16_8_ = uStack_70;
      auVar166._0_16_ = auVar173;
      auVar166._24_8_ = uStack_68;
      local_44c0 = vpmaxsw_avx2(auVar64,auVar166);
      auVar165._16_8_ = uStack_70;
      auVar165._0_16_ = auVar173;
      auVar165._24_8_ = uStack_68;
      local_44e0 = vpmaxsw_avx2(auVar65,auVar165);
      auVar164._16_8_ = uStack_70;
      auVar164._0_16_ = auVar173;
      auVar164._24_8_ = uStack_68;
      local_4500 = vpmaxsw_avx2(auVar66,auVar164);
      auVar163._16_8_ = uStack_70;
      auVar163._0_16_ = auVar173;
      auVar163._24_8_ = uStack_68;
      local_4520 = vpmaxsw_avx2(auVar67,auVar163);
      auVar162._16_8_ = uStack_70;
      auVar162._0_16_ = auVar173;
      auVar162._24_8_ = uStack_68;
      local_4540 = vpmaxsw_avx2(auVar68,auVar162);
    }
    *local_3cf0 = local_4460._0_8_;
    local_3cf0[1] = local_4460._8_8_;
    local_3cf0[2] = local_4460._16_8_;
    local_3cf0[3] = local_4460._24_8_;
    local_3cf0[4] = local_4480._0_8_;
    local_3cf0[5] = local_4480._8_8_;
    local_3cf0[6] = local_4480._16_8_;
    local_3cf0[7] = local_4480._24_8_;
    local_3cf0[8] = local_44a0._0_8_;
    local_3cf0[9] = local_44a0._8_8_;
    local_3cf0[10] = local_44a0._16_8_;
    local_3cf0[0xb] = local_44a0._24_8_;
    local_3cf0[0xc] = local_44c0._0_8_;
    local_3cf0[0xd] = local_44c0._8_8_;
    local_3cf0[0xe] = local_44c0._16_8_;
    local_3cf0[0xf] = local_44c0._24_8_;
    local_3cf0[0x10] = local_44e0._0_8_;
    local_3cf0[0x11] = local_44e0._8_8_;
    local_3cf0[0x12] = local_44e0._16_8_;
    local_3cf0[0x13] = local_44e0._24_8_;
    local_3cf0[0x14] = local_4500._0_8_;
    local_3cf0[0x15] = local_4500._8_8_;
    local_3cf0[0x16] = local_4500._16_8_;
    local_3cf0[0x17] = local_4500._24_8_;
    local_3cf0[0x18] = local_4520._0_8_;
    local_3cf0[0x19] = local_4520._8_8_;
    local_3cf0[0x1a] = local_4520._16_8_;
    local_3cf0[0x1b] = local_4520._24_8_;
    local_3cf0[0x1c] = local_4540._0_8_;
    local_3cf0[0x1d] = local_4540._8_8_;
    local_3cf0[0x1e] = local_4540._16_8_;
    local_3cf0[0x1f] = local_4540._24_8_;
    local_3cf0 = local_3cf0 + 0x20;
  }
  return;
}

Assistant:

void dct2_butterfly_h16_avx2(s16* src, int i_src, s16* dst, int line, int shift, int bit_depth)
{
    const __m256i c16_p43_p45 = _mm256_set1_epi32(0x002B002D);		//row0 
    const __m256i c16_p35_p40 = _mm256_set1_epi32(0x00230028);
    const __m256i c16_p21_p29 = _mm256_set1_epi32(0x0015001D);
    const __m256i c16_p04_p13 = _mm256_set1_epi32(0x0004000D);
    const __m256i c16_p29_p43 = _mm256_set1_epi32(0x001D002B);		//row1
    const __m256i c16_n21_p04 = _mm256_set1_epi32(0xFFEB0004);
    const __m256i c16_n45_n40 = _mm256_set1_epi32(0xFFD3FFD8);
    const __m256i c16_n13_n35 = _mm256_set1_epi32(0xFFF3FFDD);
    const __m256i c16_p04_p40 = _mm256_set1_epi32(0x00040028);		//row2
    const __m256i c16_n43_n35 = _mm256_set1_epi32(0xFFD5FFDD);
    const __m256i c16_p29_n13 = _mm256_set1_epi32(0x001DFFF3);
    const __m256i c16_p21_p45 = _mm256_set1_epi32(0x0015002D);
    const __m256i c16_n21_p35 = _mm256_set1_epi32(0xFFEB0023);		//row3
    const __m256i c16_p04_n43 = _mm256_set1_epi32(0x0004FFD5);
    const __m256i c16_p13_p45 = _mm256_set1_epi32(0x000D002D);
    const __m256i c16_n29_n40 = _mm256_set1_epi32(0xFFE3FFD8);
    const __m256i c16_n40_p29 = _mm256_set1_epi32(0xFFD8001D);		//row4
    const __m256i c16_p45_n13 = _mm256_set1_epi32(0x002DFFF3);
    const __m256i c16_n43_n04 = _mm256_set1_epi32(0xFFD5FFFC);
    const __m256i c16_p35_p21 = _mm256_set1_epi32(0x00230015);
    const __m256i c16_n45_p21 = _mm256_set1_epi32(0xFFD30015);		//row5
    const __m256i c16_p13_p29 = _mm256_set1_epi32(0x000D001D);
    const __m256i c16_p35_n43 = _mm256_set1_epi32(0x0023FFD5);
    const __m256i c16_n40_p04 = _mm256_set1_epi32(0xFFD80004);
    const __m256i c16_n35_p13 = _mm256_set1_epi32(0xFFDD000D);		//row6
    const __m256i c16_n40_p45 = _mm256_set1_epi32(0xFFD8002D);
    const __m256i c16_p04_p21 = _mm256_set1_epi32(0x00040015);
    const __m256i c16_p43_n29 = _mm256_set1_epi32(0x002BFFE3);
    const __m256i c16_n13_p04 = _mm256_set1_epi32(0xFFF30004);		//row7
    const __m256i c16_n29_p21 = _mm256_set1_epi32(0xFFE30015);
    const __m256i c16_n40_p35 = _mm256_set1_epi32(0xFFD80023);
    const __m256i c16_n45_p43 = _mm256_set1_epi32(0xFFD3002B);
    const __m256i c16_p38_p44 = _mm256_set1_epi32(0x0026002C);
    const __m256i c16_p09_p25 = _mm256_set1_epi32(0x00090019);
    const __m256i c16_n09_p38 = _mm256_set1_epi32(0xFFF70026);
    const __m256i c16_n25_n44 = _mm256_set1_epi32(0xFFE7FFD4);
    const __m256i c16_n44_p25 = _mm256_set1_epi32(0xFFD40019);
    const __m256i c16_p38_p09 = _mm256_set1_epi32(0x00260009);
    const __m256i c16_n25_p09 = _mm256_set1_epi32(0xFFE70009);
    const __m256i c16_n44_p38 = _mm256_set1_epi32(0xFFD40026);
    const __m256i c16_p17_p42 = _mm256_set1_epi32(0x0011002A);
    const __m256i c16_n42_p17 = _mm256_set1_epi32(0xFFD60011);
    const __m256i c16_n32_p32 = _mm256_set1_epi32(0xFFE00020);
    const __m256i c16_p32_p32 = _mm256_set1_epi32(0x00200020);
    int i;
    __m256i c32_off = _mm256_set1_epi32(1 << (shift - 1));
    __m128i src00, src01, src02, src03, src04, src05, src06, src07;
    __m128i src08, src09, src10, src11, src12, src13, src14, src15;
    __m128i ss0, ss1, ss2, ss3, ss4, ss5, ss6, ss7;
    __m256i res00, res01, res02, res03, res04, res05, res06, res07;
    __m256i t0, t1, t2, t3, t4, t5, t6, t7;
    __m256i t00, t01, t02, t03;
    __m256i o0, o1, o2, o3, o4, o5, o6, o7;
    __m256i eo0, eo1, eo2, eo3;
    __m256i eeo0, eeo1;
    __m256i eee0, eee1;

    for (i = 0; i < line; i += 8)
    {
        src01 = _mm_load_si128((const __m128i*)&src[1 * i_src + i]);    // [17 16 15 14 13 12 11 10]
        src03 = _mm_load_si128((const __m128i*)&src[3 * i_src + i]);    // [37 36 35 34 33 32 31 30]
        src05 = _mm_load_si128((const __m128i*)&src[5 * i_src + i]);    // [57 56 55 54 53 52 51 50]
        src07 = _mm_load_si128((const __m128i*)&src[7 * i_src + i]);    // [77 76 75 74 73 72 71 70]
        src09 = _mm_load_si128((const __m128i*)&src[9 * i_src + i]);
        src11 = _mm_load_si128((const __m128i*)&src[11 * i_src + i]);
        src13 = _mm_load_si128((const __m128i*)&src[13 * i_src + i]);
        src15 = _mm_load_si128((const __m128i*)&src[15 * i_src + i]);

        ss0 = _mm_unpacklo_epi16(src01, src03);
        ss1 = _mm_unpacklo_epi16(src05, src07);
        ss2 = _mm_unpacklo_epi16(src09, src11);
        ss3 = _mm_unpacklo_epi16(src13, src15);
        ss4 = _mm_unpackhi_epi16(src01, src03);
        ss5 = _mm_unpackhi_epi16(src05, src07);
        ss6 = _mm_unpackhi_epi16(src09, src11);
        ss7 = _mm_unpackhi_epi16(src13, src15);

        t0 = _mm256_set_m128i(ss4, ss0);
        t1 = _mm256_set_m128i(ss5, ss1);
        t2 = _mm256_set_m128i(ss6, ss2);
        t3 = _mm256_set_m128i(ss7, ss3);
#define COMPUTE_ROW(row0103, row0507, row0911, row1315, c0103, c0507, c0911, c1315, row) \
        t00 = _mm256_madd_epi16(row0103, c0103); \
        t01 = _mm256_madd_epi16(row0507, c0507); \
        t02 = _mm256_madd_epi16(row0911, c0911); \
        t03 = _mm256_madd_epi16(row1315, c1315); \
	    t00 = _mm256_add_epi32(t00, t01); \
	    t01 = _mm256_add_epi32(t02, t03); \
	    row = _mm256_add_epi32(t00, t01);

        COMPUTE_ROW(t0, t1, t2, t3, c16_p43_p45, c16_p35_p40, c16_p21_p29, c16_p04_p13, o0)
        COMPUTE_ROW(t0, t1, t2, t3, c16_p29_p43, c16_n21_p04, c16_n45_n40, c16_n13_n35, o1)
        COMPUTE_ROW(t0, t1, t2, t3, c16_p04_p40, c16_n43_n35, c16_p29_n13, c16_p21_p45, o2)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n21_p35, c16_p04_n43, c16_p13_p45, c16_n29_n40, o3)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n40_p29, c16_p45_n13, c16_n43_n04, c16_p35_p21, o4)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n45_p21, c16_p13_p29, c16_p35_n43, c16_n40_p04, o5)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n35_p13, c16_n40_p45, c16_p04_p21, c16_p43_n29, o6)
        COMPUTE_ROW(t0, t1, t2, t3, c16_n13_p04, c16_n29_p21, c16_n40_p35, c16_n45_p43, o7)

#undef COMPUTE_ROW

        src00 = _mm_load_si128((const __m128i*)&src[0 * i_src + i]);    // [07 06 05 04 03 02 01 00]
        src02 = _mm_load_si128((const __m128i*)&src[2 * i_src + i]);    // [27 26 25 24 23 22 21 20]
        src04 = _mm_load_si128((const __m128i*)&src[4 * i_src + i]);    // [47 46 45 44 43 42 41 40]
        src06 = _mm_load_si128((const __m128i*)&src[6 * i_src + i]);    // [67 66 65 64 63 62 61 60]
        src08 = _mm_load_si128((const __m128i*)&src[8 * i_src + i]);
        src10 = _mm_load_si128((const __m128i*)&src[10 * i_src + i]);
        src12 = _mm_load_si128((const __m128i*)&src[12 * i_src + i]);
        src14 = _mm_load_si128((const __m128i*)&src[14 * i_src + i]);

        ss0 = _mm_unpacklo_epi16(src02, src06);
        ss1 = _mm_unpacklo_epi16(src10, src14);
        ss2 = _mm_unpacklo_epi16(src04, src12);
        ss3 = _mm_unpacklo_epi16(src00, src08);
        ss4 = _mm_unpackhi_epi16(src02, src06);
        ss5 = _mm_unpackhi_epi16(src10, src14);
        ss6 = _mm_unpackhi_epi16(src04, src12);
        ss7 = _mm_unpackhi_epi16(src00, src08);

        t4 = _mm256_set_m128i(ss4, ss0);
        t5 = _mm256_set_m128i(ss5, ss1);
        t6 = _mm256_set_m128i(ss6, ss2);
        t7 = _mm256_set_m128i(ss7, ss3);

        eo0 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_p38_p44), _mm256_madd_epi16(t5, c16_p09_p25)); // EO0
        eo1 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n09_p38), _mm256_madd_epi16(t5, c16_n25_n44)); // EO1
        eo2 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n44_p25), _mm256_madd_epi16(t5, c16_p38_p09)); // EO2
        eo3 = _mm256_add_epi32(_mm256_madd_epi16(t4, c16_n25_p09), _mm256_madd_epi16(t5, c16_n44_p38)); // EO3

        eeo0 = _mm256_madd_epi16(t6, c16_p17_p42);
        eeo1 = _mm256_madd_epi16(t6, c16_n42_p17);

        eee0 = _mm256_madd_epi16(t7, c16_p32_p32);
        eee1 = _mm256_madd_epi16(t7, c16_n32_p32);

        {
            const __m256i ee0 = _mm256_add_epi32(eee0, eeo0);       // EE0 = EEE0 + EEO0
            const __m256i ee1 = _mm256_add_epi32(eee1, eeo1);       // EE1 = EEE1 + EEO1
            const __m256i ee3 = _mm256_sub_epi32(eee0, eeo0);       // EE2 = EEE0 - EEO0
            const __m256i ee2 = _mm256_sub_epi32(eee1, eeo1);       // EE3 = EEE1 - EEO1

            const __m256i e0 = _mm256_add_epi32(ee0, eo0);          // E0 = EE0 + EO0
            const __m256i e1 = _mm256_add_epi32(ee1, eo1);          // E1 = EE1 + EO1
            const __m256i e2 = _mm256_add_epi32(ee2, eo2);          // E2 = EE2 + EO2
            const __m256i e3 = _mm256_add_epi32(ee3, eo3);          // E3 = EE3 + EO3
            const __m256i e7 = _mm256_sub_epi32(ee0, eo0);          // E0 = EE0 - EO0
            const __m256i e6 = _mm256_sub_epi32(ee1, eo1);          // E1 = EE1 - EO1
            const __m256i e5 = _mm256_sub_epi32(ee2, eo2);          // E2 = EE2 - EO2
            const __m256i e4 = _mm256_sub_epi32(ee3, eo3);          // E3 = EE3 - EO3

            const __m256i t10 = _mm256_add_epi32(e0, c32_off);      // E0 + off
            const __m256i t11 = _mm256_add_epi32(e1, c32_off);      // E1 + off
            const __m256i t12 = _mm256_add_epi32(e2, c32_off);      // E2 + off
            const __m256i t13 = _mm256_add_epi32(e3, c32_off);      // E3 + off
            const __m256i t14 = _mm256_add_epi32(e4, c32_off);      // E4 + off
            const __m256i t15 = _mm256_add_epi32(e5, c32_off);      // E5 + off
            const __m256i t16 = _mm256_add_epi32(e6, c32_off);      // E6 + off
            const __m256i t17 = _mm256_add_epi32(e7, c32_off);      // E7 + off

            __m256i T20 = _mm256_add_epi32(t10, o0);                // E0 + O0 + off
            __m256i T21 = _mm256_add_epi32(t11, o1);                // E1 + O1 + off
            __m256i T22 = _mm256_add_epi32(t12, o2);                // E2 + O2 + off
            __m256i T23 = _mm256_add_epi32(t13, o3);                // E3 + O3 + off
            __m256i T24 = _mm256_add_epi32(t14, o4);                // E4
            __m256i T25 = _mm256_add_epi32(t15, o5);                // E5
            __m256i T26 = _mm256_add_epi32(t16, o6);                // E6
            __m256i T27 = _mm256_add_epi32(t17, o7);                // E7
            __m256i T2F = _mm256_sub_epi32(t10, o0);                // E0 - O0 + off
            __m256i T2E = _mm256_sub_epi32(t11, o1);                // E1 - O1 + off
            __m256i T2D = _mm256_sub_epi32(t12, o2);                // E2 - O2 + off
            __m256i T2C = _mm256_sub_epi32(t13, o3);                // E3 - O3 + off
            __m256i T2B = _mm256_sub_epi32(t14, o4);                // E4
            __m256i T2A = _mm256_sub_epi32(t15, o5);                // E5
            __m256i T29 = _mm256_sub_epi32(t16, o6);                // E6
            __m256i T28 = _mm256_sub_epi32(t17, o7);                // E7

            T20 = _mm256_srai_epi32(T20, shift);                    // [30 20 10 00]
            T21 = _mm256_srai_epi32(T21, shift);                    // [31 21 11 01]
            T22 = _mm256_srai_epi32(T22, shift);                    // [32 22 12 02]
            T23 = _mm256_srai_epi32(T23, shift);                    // [33 23 13 03]
            T24 = _mm256_srai_epi32(T24, shift);                    // [33 24 14 04]
            T25 = _mm256_srai_epi32(T25, shift);                    // [35 25 15 05]
            T26 = _mm256_srai_epi32(T26, shift);                    // [36 26 16 06]
            T27 = _mm256_srai_epi32(T27, shift);                    // [37 27 17 07]
            T28 = _mm256_srai_epi32(T28, shift);                    // [30 20 10 00] x8
            T29 = _mm256_srai_epi32(T29, shift);                    // [31 21 11 01] x9
            T2A = _mm256_srai_epi32(T2A, shift);                    // [32 22 12 02] xA
            T2B = _mm256_srai_epi32(T2B, shift);                    // [33 23 13 03] xB
            T2C = _mm256_srai_epi32(T2C, shift);                    // [33 24 14 04] xC
            T2D = _mm256_srai_epi32(T2D, shift);                    // [35 25 15 05] xD
            T2E = _mm256_srai_epi32(T2E, shift);                    // [36 26 16 06] xE
            T2F = _mm256_srai_epi32(T2F, shift);                    // [37 27 17 07] xF

            // transpose 16x8 --> 8x16
            TRANSPOSE_16x8_32BIT_16BIT(T20, T21, T22, T23, T24, T25, T26, T27, 
                T28, T29, T2A, T2B, T2C, T2D, T2E, T2F, res00, res01, res02, res03, res04, res05, res06, res07);
        }
        if (bit_depth != MAX_TX_DYNAMIC_RANGE) {
            __m256i max_val = _mm256_set1_epi16((1 << bit_depth) - 1);
            __m256i min_val = _mm256_set1_epi16(-(1 << bit_depth));

            res00 = _mm256_min_epi16(res00, max_val);
            res01 = _mm256_min_epi16(res01, max_val);
            res02 = _mm256_min_epi16(res02, max_val);
            res03 = _mm256_min_epi16(res03, max_val);
            res04 = _mm256_min_epi16(res04, max_val);
            res05 = _mm256_min_epi16(res05, max_val);
            res06 = _mm256_min_epi16(res06, max_val);
            res07 = _mm256_min_epi16(res07, max_val);
            res00 = _mm256_max_epi16(res00, min_val);
            res01 = _mm256_max_epi16(res01, min_val);
            res02 = _mm256_max_epi16(res02, min_val);
            res03 = _mm256_max_epi16(res03, min_val);
            res04 = _mm256_max_epi16(res04, min_val);
            res05 = _mm256_max_epi16(res05, min_val);
            res06 = _mm256_max_epi16(res06, min_val);
            res07 = _mm256_max_epi16(res07, min_val);

        }

        _mm256_store_si256((__m256i*)&dst[16 * 0], res00);
        _mm256_store_si256((__m256i*)&dst[16 * 1], res01);
        _mm256_store_si256((__m256i*)&dst[16 * 2], res02);
        _mm256_store_si256((__m256i*)&dst[16 * 3], res03);
        _mm256_store_si256((__m256i*)&dst[16 * 4], res04);
        _mm256_store_si256((__m256i*)&dst[16 * 5], res05);
        _mm256_store_si256((__m256i*)&dst[16 * 6], res06);
        _mm256_store_si256((__m256i*)&dst[16 * 7], res07);

        dst += 16*8; // 8 rows
    }
}